

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O2

bool date::rfc3339::validate(parts *dt)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  bool bVar6;
  
  if (dt->year != 0) {
    if (((byte)(dt->month - 0xd) < 0xf4) || (bVar1 = dt->day, bVar1 == 0)) {
      bVar6 = false;
    }
    else {
      bVar3 = calendar_helper::days_in_month(dt->year,dt->month);
      bVar4 = false;
      bVar6 = false;
      if ((((bVar1 <= bVar3) && (bVar6 = bVar4, dt->hour < 0x18)) && (dt->minute < 0x3c)) &&
         ((dt->second < 0x3c && (dt->nanosecond < 1000000000)))) {
        uVar2 = dt->offset_in_minutes;
        uVar5 = -uVar2;
        if (0 < (short)uVar2) {
          uVar5 = uVar2;
        }
        bVar6 = uVar5 < 0x5a0;
      }
    }
    return bVar6;
  }
  return false;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (dt.nanosecond > 999999999)
            return false;
        if (std::abs(dt.offset_in_minutes) > 1439)
            return false;
        return true;
    }